

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

int ConvexDecomposition::maxdirsterid<ConvexDecomposition::float3>
              (float3 *p,int count,float3 *dir,Array<int> *allow)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint unaff_EBP;
  ulong uVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  undefined1 in_ZMM0 [64];
  undefined1 auVar16 [64];
  float fVar18;
  undefined1 in_ZMM1 [64];
  undefined1 auVar19 [64];
  float3 fVar21;
  uint local_a4;
  uint local_94;
  float3 local_70;
  uint local_60;
  float local_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 auVar17 [56];
  undefined1 auVar20 [60];
  
  uVar9 = 0xffffffff;
  while( true ) {
    auVar20 = in_ZMM1._4_60_;
    auVar17 = in_ZMM0._8_56_;
    if (uVar9 != 0xffffffff) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0x8e0,
                    "int ConvexDecomposition::maxdirsterid(const T *, int, const T &, Array<int> &) [T = ConvexDecomposition::float3]"
                   );
    }
    uVar9 = maxdirfiltered<ConvexDecomposition::float3>(p,count,dir,allow);
    if (((int)uVar9 < 0) || (allow->count <= (int)uVar9)) break;
    if (allow->element[uVar9] == 3) {
      return uVar9;
    }
    fVar21 = orth(dir);
    auVar19._0_4_ = fVar21.z;
    auVar19._4_60_ = auVar20;
    auVar16._0_8_ = fVar21._0_8_;
    auVar16._8_56_ = auVar17;
    local_48 = auVar16._0_16_;
    local_58 = vmovshdup_avx(local_48);
    auVar2 = vfmsub231ss_fma(ZEXT416((uint)(dir->y * auVar19._0_4_)),local_58,ZEXT416((uint)dir->z))
    ;
    auVar3 = vfmsub231ss_fma(ZEXT416((uint)(dir->z * fVar21.x)),auVar19._0_16_,ZEXT416((uint)dir->x)
                            );
    auVar4 = vfmsub231ss_fma(ZEXT416((uint)(dir->x * local_58._0_4_)),local_48,ZEXT416((uint)dir->y)
                            );
    in_ZMM1 = ZEXT864(0) << 0x20;
    local_a4 = 0xffffffff;
    uVar12 = 0;
    do {
      fVar18 = in_ZMM1._0_4_;
      fVar14 = sinf(fVar18 * 0.017453292);
      fVar15 = cosf(fVar18 * 0.017453292);
      auVar1 = vinsertps_avx(ZEXT416((uint)((fVar14 * (float)local_48._0_4_ + fVar15 * auVar2._0_4_)
                                            * 0.025 + dir->x)),
                             ZEXT416((uint)((fVar14 * (float)local_58._0_4_ + fVar15 * auVar3._0_4_)
                                            * 0.025 + dir->y)),0x10);
      local_70.z = (fVar14 * auVar19._0_4_ + fVar15 * auVar4._0_4_) * 0.025 + dir->z;
      in_ZMM0 = ZEXT464((uint)local_70.z);
      local_70._0_8_ = vmovlps_avx(auVar1);
      uVar10 = maxdirfiltered<ConvexDecomposition::float3>(p,count,&local_70,allow);
      if (uVar10 == uVar9 && local_a4 == uVar9) {
        if (allow->count <= (int)uVar9) goto LAB_00933ee5;
        allow->element[uVar9] = 3;
        bVar13 = false;
        unaff_EBP = uVar9;
      }
      else if (local_a4 == uVar10 || local_a4 == 0xffffffff) {
        bVar13 = true;
        local_a4 = uVar10;
      }
      else {
        local_60 = (uint)uVar12;
        bVar13 = true;
        uVar8 = local_a4;
        fVar14 = local_5c;
        local_94 = unaff_EBP;
        local_5c = fVar18 + -40.0;
        while( true ) {
          bVar7 = fVar18 < local_5c;
          in_ZMM0 = ZEXT464((uint)local_5c);
          if (bVar7) break;
          fVar14 = local_5c * 0.017453292;
          fVar15 = sinf(fVar14);
          fVar14 = cosf(fVar14);
          auVar1 = vinsertps_avx(ZEXT416((uint)((fVar15 * (float)local_48._0_4_ +
                                                fVar14 * auVar2._0_4_) * 0.025 + dir->x)),
                                 ZEXT416((uint)((fVar15 * (float)local_58._0_4_ +
                                                fVar14 * auVar3._0_4_) * 0.025 + dir->y)),0x10);
          local_70.z = (fVar15 * auVar19._0_4_ + fVar14 * auVar4._0_4_) * 0.025 + dir->z;
          in_ZMM0 = ZEXT464((uint)local_70.z);
          local_70._0_8_ = vmovlps_avx(auVar1);
          uVar11 = maxdirfiltered<ConvexDecomposition::float3>(p,count,&local_70,allow);
          bVar5 = uVar11 != uVar9;
          bVar6 = uVar8 != uVar9;
          bVar13 = bVar5 || bVar6;
          if (!bVar5 && !bVar6) {
            if (allow->count <= (int)uVar9) goto LAB_00933ee5;
            allow->element[uVar9] = 3;
            uVar11 = uVar8;
            local_94 = uVar9;
          }
          fVar14 = local_5c;
          if (!bVar5 && !bVar6) break;
          uVar8 = uVar11;
          local_5c = local_5c + 5.0;
        }
        local_5c = fVar14;
        if (bVar7) {
          local_a4 = uVar10;
        }
        bVar13 = (bool)(bVar13 | bVar7);
        uVar12 = (ulong)local_60;
        unaff_EBP = local_94;
      }
      in_ZMM1 = ZEXT464((uint)fVar18);
      if (!bVar13) break;
      fVar18 = fVar18 + 45.0;
      in_ZMM1 = ZEXT464((uint)fVar18);
      in_ZMM0 = ZEXT464(0x43b40000);
      uVar12 = CONCAT71((int7)(uVar12 >> 8),360.0 < fVar18);
    } while (360.0 >= fVar18);
    if ((uVar12 & 1) != 0) {
      if (allow->count <= (int)uVar9) break;
      allow->element[uVar9] = 0;
      uVar9 = 0xffffffff;
    }
    if ((uVar12 & 1) == 0) {
      return unaff_EBP;
    }
  }
LAB_00933ee5:
  __assert_fail("i>=0 && i<count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                ,0x577,"Type &ConvexDecomposition::Array<int>::operator[](int) [Type = int]");
}

Assistant:

int maxdirsterid(const T *p,int count,const T &dir,Array<int> &allow)
{
	int m=-1;
	while(m==-1)
	{
		m = maxdirfiltered(p,count,dir,allow);
		if(allow[m]==3) return m;
		T u = orth(dir);
		T v = cross(u,dir);
		int ma=-1;
		for(float x = 0.0f ; x<= 360.0f ; x+= 45.0f)
		{
			float s = sinf(DEG2RAD*(x));
			float c = cosf(DEG2RAD*(x));
			int mb = maxdirfiltered(p,count,dir+(u*s+v*c)*0.025f,allow);
			if(ma==m && mb==m)
			{
				allow[m]=3;
				return m;
			}
			if(ma!=-1 && ma!=mb)  // Yuck - this is really ugly
			{
				int mc = ma;
				for(float xx = x-40.0f ; xx <= x ; xx+= 5.0f)
				{
					float s = sinf(DEG2RAD*(xx));
					float c = cosf(DEG2RAD*(xx));
					int md = maxdirfiltered(p,count,dir+(u*s+v*c)*0.025f,allow);
					if(mc==m && md==m)
					{
						allow[m]=3;
						return m;
					}
					mc=md;
				}
			}
			ma=mb;
		}
		allow[m]=0;
		m=-1;
	}
	assert(0);
	return m;
}